

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hasher.cpp
# Opt level: O3

void __thiscall crypto::hasher::hasher(hasher *this,checksum_type type)

{
  this->active_type = type;
  switch(type) {
  case Adler32:
    (this->field_1).adler32.state = 1;
    break;
  case CRC32:
    (this->field_1).adler32.state = 0xffffffff;
    return;
  case MD5:
    *(undefined8 *)((long)&this->field_1 + 0x50) = 0;
    md5_transform::init((EVP_PKEY_CTX *)((long)&this->field_1 + 0x40));
    return;
  case SHA1:
    *(undefined8 *)((long)&this->field_1 + 0x54) = 0;
    sha1_transform::init((EVP_PKEY_CTX *)((long)&this->field_1 + 0x40));
    return;
  case SHA256:
    *(undefined8 *)((long)&this->field_1 + 0x60) = 0;
    sha256_transform::init((EVP_PKEY_CTX *)((long)&this->field_1 + 0x40));
    return;
  }
  return;
}

Assistant:

hasher::hasher(checksum_type type) : active_type(type) {
	
	switch(active_type) {
		case crypto::None: break;
		case crypto::Adler32: adler32.init(); break;
		case crypto::CRC32: crc32.init(); break;
		case crypto::MD5: md5.init(); break;
		case crypto::SHA1: sha1.init(); break;
		case crypto::SHA256: sha256.init(); break;
		case crypto::PBKDF2_SHA256_XChaCha20: break;
	};
	
}